

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_getInfoType(void *highs,char *info,HighsInt *type)

{
  HighsStatus HVar1;
  HighsInfoType t;
  allocator local_45;
  HighsInfoType local_44;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,info,&local_45);
  HVar1 = Highs::getInfoType((Highs *)highs,&local_40,&local_44);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  *type = local_44;
  return HVar1;
}

Assistant:

HighsInt Highs_getInfoType(const void* highs, const char* info,
                           HighsInt* type) {
  HighsInfoType t;
  HighsInt retcode =
      (HighsInt)((Highs*)highs)->getInfoType(std::string(info), t);
  *type = (HighsInt)t;
  return retcode;
}